

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicFboMultisampleCase::render(BasicFboMultisampleCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int dstX1;
  DataType DVar4;
  Context *pCVar5;
  int *piVar6;
  int local_54c;
  deUint32 *local_548;
  deUint32 *local_540;
  deUint32 *local_538;
  bool local_502;
  bool local_501;
  Vector<float,_3> local_4f4;
  Vector<float,_3> local_4e8;
  Vector<float,_4> local_4dc;
  Vector<float,_4> local_4cc;
  Vector<float,_4> local_4bc;
  Vec4 local_4ac;
  float local_49c;
  float local_498;
  float c_1;
  int s;
  int ndx_3;
  int step_1;
  int numSteps_1;
  Vector<float,_3> local_47c;
  Vector<float,_4> local_470;
  Vector<float,_4> local_460;
  Vector<float,_4> local_450;
  Vec4 local_440;
  float local_430;
  float local_42c;
  float c;
  float d;
  int ndx_2;
  float step;
  int numSteps;
  Vector<float,_3> local_410;
  Vector<float,_4> local_404;
  Vector<float,_4> local_3f4;
  Vector<float,_4> local_3e4;
  Vec4 local_3d4;
  float local_3c4;
  float local_3c0;
  float z1;
  float y1;
  float x1;
  float z0;
  float y0;
  float x0;
  float a;
  float b;
  float g;
  float r;
  int ndx_1;
  Random rnd;
  int numQuads;
  Vector<float,_3> local_378;
  int local_36c;
  deUint32 *pdStack_368;
  int samples;
  deUint32 *depthStencilRbo;
  deUint32 *colorRbo;
  deUint32 *fbo;
  int ndx;
  deUint32 resolveDepthStencilRbo;
  deUint32 msaaDepthStencilRbo;
  deUint32 resolveColorRbo;
  deUint32 msaaColorRbo;
  deUint32 resolveFbo;
  deUint32 msaaFbo;
  deUint32 flatShaderID;
  deUint32 gradShaderID;
  undefined1 local_320 [8];
  FlatColorShader flatShader;
  GradientShader gradShader;
  undefined1 local_68 [6];
  bool stencil;
  bool depth;
  TextureFormatInfo colorFmtInfo;
  TextureFormat depthStencilFmt;
  TextureFormat colorFmt;
  Surface *dst_local;
  BasicFboMultisampleCase *this_local;
  
  depthStencilFmt = glu::mapGLInternalFormat(this->m_colorFormat);
  if (this->m_depthStencilFormat == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  }
  else {
    colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_depthStencilFormat);
  }
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_68,&depthStencilFmt);
  local_501 = colorFmtInfo.lookupBias.m_data[2] == 2.52234e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  local_502 = colorFmtInfo.lookupBias.m_data[2] == 2.66247e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  DVar4 = FboTestUtil::getFragmentOutputType(&depthStencilFmt);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader,DVar4);
  DVar4 = FboTestUtil::getFragmentOutputType(&depthStencilFmt);
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)local_320,DVar4);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  msaaFbo = (*pCVar5->_vptr_Context[0x75])
                      (pCVar5,&flatShader.super_ShaderProgram.m_hasGeometryShader);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  resolveFbo = (*pCVar5->_vptr_Context[0x75])(pCVar5,local_320);
  msaaColorRbo = 0;
  resolveColorRbo = 0;
  msaaDepthStencilRbo = 0;
  resolveDepthStencilRbo = 0;
  ndx = 0;
  fbo._4_4_ = 0;
  for (fbo._0_4_ = 0; (int)fbo < 2; fbo._0_4_ = (int)fbo + 1) {
    if ((int)fbo == 0) {
      local_538 = &msaaColorRbo;
    }
    else {
      local_538 = &resolveColorRbo;
    }
    colorRbo = local_538;
    if ((int)fbo == 0) {
      local_540 = &msaaDepthStencilRbo;
    }
    else {
      local_540 = &resolveDepthStencilRbo;
    }
    depthStencilRbo = local_540;
    if ((int)fbo == 0) {
      local_548 = (deUint32 *)&ndx;
    }
    else {
      local_548 = (deUint32 *)((long)&fbo + 4);
    }
    pdStack_368 = local_548;
    if ((int)fbo == 0) {
      local_54c = this->m_numSamples;
    }
    else {
      local_54c = 0;
    }
    local_36c = local_54c;
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,local_540);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,*depthStencilRbo);
    iVar3 = local_36c;
    dVar1 = this->m_colorFormat;
    piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
    iVar2 = *piVar6;
    piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,iVar3,dVar1,iVar2,*piVar6);
    if ((local_501) || (local_502)) {
      sglr::ContextWrapper::glGenRenderbuffers
                (&(this->super_FboTestCase).super_ContextWrapper,1,pdStack_368);
      sglr::ContextWrapper::glBindRenderbuffer
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,*pdStack_368);
      iVar3 = local_36c;
      dVar1 = this->m_depthStencilFormat;
      piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
      iVar2 = *piVar6;
      piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
      sglr::ContextWrapper::glRenderbufferStorageMultisample
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,iVar3,dVar1,iVar2,*piVar6);
    }
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,colorRbo);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,*colorRbo);
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,*depthStencilRbo
              );
    if (local_501) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,*pdStack_368);
    }
    if (local_502) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,*pdStack_368);
    }
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  }
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,msaaColorRbo);
  piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,*piVar6);
  sglr::ContextWrapper::glClearBufferfi
            (&(this->super_FboTestCase).super_ContextWrapper,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader,pCVar5,msaaFbo,
             (Vec4 *)local_68,(Vec4 *)(colorFmtInfo.valueMin.m_data + 2));
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = msaaFbo;
  tcu::Vector<float,_3>::Vector(&local_378,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&rnd.m_rnd.w,1.0,1.0,1.0);
  sglr::drawQuad(pCVar5,dVar1,&local_378,(Vec3 *)&rnd.m_rnd.w);
  rnd.m_rnd.z = 8;
  de::Random::Random((Random *)&r,9);
  sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,0,0xff);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e02);
  for (g = 0.0; (int)g < 8; g = (float)((int)g + 1)) {
    b = de::Random::getFloat((Random *)&r);
    a = de::Random::getFloat((Random *)&r);
    x0 = de::Random::getFloat((Random *)&r);
    y0 = de::Random::getFloat((Random *)&r);
    z0 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    x1 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    y1 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    z1 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    local_3c0 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    local_3c4 = de::Random::getFloat((Random *)&r,-1.0,1.0);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = resolveFbo;
    tcu::Vector<float,_4>::Vector(&local_3f4,b,a,x0,y0);
    tcu::operator-((tcu *)&local_404,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)local_68);
    tcu::operator*((tcu *)&local_3e4,&local_3f4,&local_404);
    tcu::operator+((tcu *)&local_3d4,&local_3e4,(Vector<float,_4> *)local_68);
    FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_320,pCVar5,dVar1,&local_3d4);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = resolveFbo;
    tcu::Vector<float,_3>::Vector(&local_410,z0,x1,y1);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&step,z1,local_3c0,local_3c4);
    sglr::drawQuad(pCVar5,dVar1,&local_410,(Vec3 *)&step);
  }
  de::Random::~Random((Random *)&r);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  FboTestCase::checkError(&this->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,resolveColorRbo);
  piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
  iVar3 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
  dstX1 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glBlitFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,iVar3,0,0,dstX1,*piVar6,
             (uint)local_501 * 0x100 + 0x4000 + (uint)local_502 * 0x400,0x2600);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,resolveColorRbo);
  if (local_501) {
    ndx_2 = 8;
    d = 0.25;
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x201);
    sglr::ContextWrapper::glDepthMask(&(this->super_FboTestCase).super_ContextWrapper,0);
    sglr::ContextWrapper::glColorMask(&(this->super_FboTestCase).super_ContextWrapper,0,0,1,0);
    for (c = 0.0; (int)c < 8; c = (float)((int)c + 1)) {
      local_42c = (float)(int)c * 0.25 + -1.0;
      local_430 = (float)(int)c / 7.0;
      pCVar5 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar1 = resolveFbo;
      tcu::Vector<float,_4>::Vector(&local_460,0.0,0.0,local_430,1.0);
      tcu::operator-((tcu *)&local_470,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                     (Vector<float,_4> *)local_68);
      tcu::operator*((tcu *)&local_450,&local_460,&local_470);
      tcu::operator+((tcu *)&local_440,&local_450,(Vector<float,_4> *)local_68);
      FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_320,pCVar5,dVar1,&local_440);
      pCVar5 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar1 = resolveFbo;
      tcu::Vector<float,_3>::Vector(&local_47c,-1.0,-1.0,local_42c);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&step_1,1.0,1.0,local_42c);
      sglr::drawQuad(pCVar5,dVar1,&local_47c,(Vec3 *)&step_1);
    }
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  }
  if (local_502) {
    ndx_3 = 4;
    s = 1;
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
    sglr::ContextWrapper::glStencilOp
              (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e00);
    sglr::ContextWrapper::glColorMask(&(this->super_FboTestCase).super_ContextWrapper,0,1,0,0);
    for (c_1 = 0.0; (int)c_1 < 4; c_1 = (float)((int)c_1 + 1)) {
      local_498 = c_1;
      local_49c = (float)(int)c_1 / 3.0;
      sglr::ContextWrapper::glStencilFunc
                (&(this->super_FboTestCase).super_ContextWrapper,0x202,(int)c_1,0xff);
      pCVar5 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar1 = resolveFbo;
      tcu::Vector<float,_4>::Vector(&local_4cc,0.0,local_49c,0.0,1.0);
      tcu::operator-((tcu *)&local_4dc,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                     (Vector<float,_4> *)local_68);
      tcu::operator*((tcu *)&local_4bc,&local_4cc,&local_4dc);
      tcu::operator+((tcu *)&local_4ac,&local_4bc,(Vector<float,_4> *)local_68);
      FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_320,pCVar5,dVar1,&local_4ac);
      pCVar5 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar1 = resolveFbo;
      tcu::Vector<float,_3>::Vector(&local_4e8,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_4f4,1.0,1.0,0.0);
      sglr::drawQuad(pCVar5,dVar1,&local_4e8,&local_4f4);
    }
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  }
  piVar6 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y(&this->m_size);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar2,*piVar6,&depthStencilFmt,
             (Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
             (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)local_320);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFormat);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFormat != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFormat) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		FlatColorShader			flatShader				(getFragmentOutputType(colorFmt));
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);
		deUint32				msaaFbo					= 0;
		deUint32				resolveFbo				= 0;
		deUint32				msaaColorRbo			= 0;
		deUint32				resolveColorRbo			= 0;
		deUint32				msaaDepthStencilRbo		= 0;
		deUint32				resolveDepthStencilRbo	= 0;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo				= ndx ? resolveFbo				: msaaFbo;
			deUint32&	colorRbo		= ndx ? resolveColorRbo			: msaaColorRbo;
			deUint32&	depthStencilRbo	= ndx ? resolveDepthStencilRbo	: msaaDepthStencilRbo;
			int			samples			= ndx ? 0						: m_numSamples;

			glGenRenderbuffers(1, &colorRbo);
			glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_colorFormat, m_size.x(), m_size.y());

			if (depth || stencil)
			{
				glGenRenderbuffers(1, &depthStencilRbo);
				glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
				glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_depthStencilFormat, m_size.x(), m_size.y());
			}

			glGenFramebuffers(1, &fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
			if (depth)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
			if (stencil)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, msaaFbo);
		glViewport(0, 0, m_size.x(), m_size.y());

		// Clear depth and stencil buffers.
		glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		// Fill MSAA fbo with gradient, depth = [-1..1]
		glEnable(GL_DEPTH_TEST);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render random-colored quads.
		{
			const int		numQuads	= 8;
			de::Random		rnd			(9);

			glDepthFunc(GL_ALWAYS);
			glEnable(GL_STENCIL_TEST);
			glStencilFunc(GL_ALWAYS, 0, 0xffu);
			glStencilOp(GL_KEEP, GL_KEEP, GL_INCR);

			for (int ndx = 0; ndx < numQuads; ndx++)
			{
				float	r		= rnd.getFloat();
				float	g		= rnd.getFloat();
				float	b		= rnd.getFloat();
				float	a		= rnd.getFloat();
				float	x0		= rnd.getFloat(-1.0f, 1.0f);
				float	y0		= rnd.getFloat(-1.0f, 1.0f);
				float	z0		= rnd.getFloat(-1.0f, 1.0f);
				float	x1		= rnd.getFloat(-1.0f, 1.0f);
				float	y1		= rnd.getFloat(-1.0f, 1.0f);
				float	z1		= rnd.getFloat(-1.0f, 1.0f);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(r,g,b,a) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(x0, y0, z0), Vec3(x1, y1, z1));
			}
		}

		glDisable(GL_DEPTH_TEST);
		glDisable(GL_STENCIL_TEST);
		checkError();

		// Resolve using glBlitFramebuffer().
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, resolveFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT | (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0), GL_NEAREST);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, resolveFbo);

		if (depth)
		{
			// Visualize depth.
			const int	numSteps	= 8;
			const float	step		= 2.0f / (float)numSteps;

			glEnable(GL_DEPTH_TEST);
			glDepthFunc(GL_LESS);
			glDepthMask(GL_FALSE);
			glColorMask(GL_FALSE, GL_FALSE, GL_TRUE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				float d = -1.0f + step*(float)ndx;
				float c = (float)ndx / (float)(numSteps-1);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, c, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, d), Vec3(1.0f, 1.0f, d));
			}

			glDisable(GL_DEPTH_TEST);
		}

		if (stencil)
		{
			// Visualize stencil.
			const int	numSteps	= 4;
			const int	step		= 1;

			glEnable(GL_STENCIL_TEST);
			glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
			glColorMask(GL_FALSE, GL_TRUE, GL_FALSE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				int		s	= step*ndx;
				float	c	= (float)ndx / (float)(numSteps-1);

				glStencilFunc(GL_EQUAL, s, 0xffu);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, c, 0.0f, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}

			glDisable(GL_STENCIL_TEST);
		}

		readPixels(dst, 0, 0, m_size.x(), m_size.y(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}